

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TZGNCore::findBestMatch
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UnicodeString *tzID,
          UTimeZoneFormatTimeType *timeType,UErrorCode *status)

{
  bool bVar1;
  undefined4 uVar2;
  UBool UVar3;
  int32_t iVar4;
  UTimeZoneNameType UVar5;
  MatchInfoCollection *this_00;
  UMemory *this_01;
  uint local_fc;
  int32_t len_1;
  int32_t i_1;
  TimeZoneGenericNameMatchInfo *localMatches;
  UTimeZoneNameType nameType;
  int32_t len;
  int32_t i;
  undefined1 local_d0 [8];
  UnicodeString mzID;
  undefined1 local_88 [7];
  UBool isStandard;
  UnicodeString bestMatchTzID;
  UTimeZoneFormatTimeType bestMatchTimeType;
  int32_t bestMatchLen;
  MatchInfoCollection *tznamesMatches;
  UTimeZoneFormatTimeType *timeType_local;
  UnicodeString *tzID_local;
  uint32_t types_local;
  int32_t start_local;
  UnicodeString *text_local;
  TZGNCore *this_local;
  
  *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  UnicodeString::setToBogus(tzID);
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 != '\0') {
    return 0;
  }
  this_00 = findTimeZoneNames(this,text,start,types,status);
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 != '\0') {
    return 0;
  }
  bestMatchTzID.fUnion._52_4_ = 0;
  bestMatchTzID.fUnion._48_4_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_88);
  mzID.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
  if (this_00 != (MatchInfoCollection *)0x0) {
    UnicodeString::UnicodeString((UnicodeString *)local_d0);
    for (nameType = UTZNM_UNKNOWN; iVar4 = TimeZoneNames::MatchInfoCollection::size(this_00),
        (int)nameType < iVar4; nameType = nameType + UTZNM_LONG_GENERIC) {
      iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,nameType);
      if ((int)bestMatchTzID.fUnion._52_4_ < iVar4) {
        bestMatchTzID.fUnion._52_4_ = iVar4;
        UVar3 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt
                          (this_00,nameType,(UnicodeString *)local_88);
        if ((UVar3 == '\0') &&
           (UVar3 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt
                              (this_00,nameType,(UnicodeString *)local_d0), UVar3 != '\0')) {
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,local_d0,this->fTargetRegion,local_88);
        }
        UVar5 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(this_00,nameType);
        UVar3 = ::U_FAILURE(*status);
        if (UVar3 != '\0') break;
        switch(UVar5) {
        case UTZNM_LONG_STANDARD:
        case UTZNM_SHORT_STANDARD:
          mzID.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
          bestMatchTzID.fUnion._48_4_ = 1;
          break;
        default:
          bestMatchTzID.fUnion._48_4_ = 0;
          break;
        case UTZNM_LONG_DAYLIGHT:
        case UTZNM_SHORT_DAYLIGHT:
          bestMatchTzID.fUnion._48_4_ = 2;
        }
      }
    }
    if (this_00 != (MatchInfoCollection *)0x0) {
      (*this_00->_vptr_MatchInfoCollection[1])();
    }
    UVar3 = ::U_FAILURE(*status);
    uVar2 = bestMatchTzID.fUnion._52_4_;
    if (UVar3 == '\0') {
      iVar4 = UnicodeString::length(text);
      if ((uVar2 == iVar4 - start) && (mzID.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0')) {
        UnicodeString::setTo(tzID,(UnicodeString *)local_88);
        *timeType = bestMatchTzID.fUnion._48_4_;
        this_local._4_4_ = bestMatchTzID.fUnion._52_4_;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      this_local._4_4_ = 0;
      bVar1 = true;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_d0);
    if (bVar1) goto LAB_0023f5d7;
  }
  this_01 = (UMemory *)findLocal(this,text,start,types,status);
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 == '\0') {
    if (this_01 != (UMemory *)0x0) {
      for (local_fc = 0;
          iVar4 = TimeZoneGenericNameMatchInfo::size((TimeZoneGenericNameMatchInfo *)this_01),
          (int)local_fc < iVar4; local_fc = local_fc + 1) {
        text = (UnicodeString *)(ulong)local_fc;
        iVar4 = TimeZoneGenericNameMatchInfo::getMatchLength
                          ((TimeZoneGenericNameMatchInfo *)this_01,local_fc);
        if ((int)bestMatchTzID.fUnion._52_4_ <= iVar4) {
          bestMatchTzID.fUnion._52_4_ =
               TimeZoneGenericNameMatchInfo::getMatchLength
                         ((TimeZoneGenericNameMatchInfo *)this_01,local_fc);
          bestMatchTzID.fUnion._48_4_ = 0;
          text = (UnicodeString *)(ulong)local_fc;
          TimeZoneGenericNameMatchInfo::getTimeZoneID
                    ((TimeZoneGenericNameMatchInfo *)this_01,local_fc,(UnicodeString *)local_88);
        }
      }
      if (this_01 != (UMemory *)0x0) {
        TimeZoneGenericNameMatchInfo::~TimeZoneGenericNameMatchInfo
                  ((TimeZoneGenericNameMatchInfo *)this_01);
        UMemory::operator_delete(this_01,text);
      }
    }
    if (0 < (int)bestMatchTzID.fUnion._52_4_) {
      *timeType = bestMatchTzID.fUnion._48_4_;
      UnicodeString::setTo(tzID,(UnicodeString *)local_88);
    }
    this_local._4_4_ = bestMatchTzID.fUnion._52_4_;
  }
  else {
    this_local._4_4_ = 0;
  }
LAB_0023f5d7:
  UnicodeString::~UnicodeString((UnicodeString *)local_88);
  return this_local._4_4_;
}

Assistant:

int32_t
TZGNCore::findBestMatch(const UnicodeString& text, int32_t start, uint32_t types,
        UnicodeString& tzID, UTimeZoneFormatTimeType& timeType, UErrorCode& status) const {
    timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    tzID.setToBogus();

    if (U_FAILURE(status)) {
        return 0;
    }

    // Find matches in the TimeZoneNames first
    TimeZoneNames::MatchInfoCollection *tznamesMatches = findTimeZoneNames(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t bestMatchLen = 0;
    UTimeZoneFormatTimeType bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
    UnicodeString bestMatchTzID;
    // UBool isLongStandard = FALSE;   // workaround - see the comments below
    UBool isStandard = FALSE;       // TODO: Temporary hack (on hack) for short standard name/location name conflict (found in zh_Hant), should be removed after CLDR 21m1 integration

    if (tznamesMatches != NULL) {
        UnicodeString mzID;
        for (int32_t i = 0; i < tznamesMatches->size(); i++) {
            int32_t len = tznamesMatches->getMatchLengthAt(i);
            if (len > bestMatchLen) {
                bestMatchLen = len;
                if (!tznamesMatches->getTimeZoneIDAt(i, bestMatchTzID)) {
                    // name for a meta zone
                    if (tznamesMatches->getMetaZoneIDAt(i, mzID)) {
                        fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, bestMatchTzID);
                    }
                }
                UTimeZoneNameType nameType = tznamesMatches->getNameTypeAt(i);
                if (U_FAILURE(status)) {
                    break;
                }
                switch (nameType) {
                case UTZNM_LONG_STANDARD:
                    // isLongStandard = TRUE;
                case UTZNM_SHORT_STANDARD:  // this one is never used for generic, but just in case
                    isStandard = TRUE;      // TODO: Remove this later, see the comments above.
                    bestMatchTimeType = UTZFMT_TIME_TYPE_STANDARD;
                    break;
                case UTZNM_LONG_DAYLIGHT:
                case UTZNM_SHORT_DAYLIGHT: // this one is never used for generic, but just in case
                    bestMatchTimeType = UTZFMT_TIME_TYPE_DAYLIGHT;
                    break;
                default:
                    bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                }
            }
        }
        delete tznamesMatches;
        if (U_FAILURE(status)) {
            return 0;
        }

        if (bestMatchLen == (text.length() - start)) {
            // Full match

            //tzID.setTo(bestMatchTzID);
            //timeType = bestMatchTimeType;
            //return bestMatchLen;

            // TODO Some time zone uses a same name for the long standard name
            // and the location name. When the match is a long standard name,
            // then we need to check if the name is same with the location name.
            // This is probably a data error or a design bug.
/*
            if (!isLongStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
*/
            // TODO The deprecation of commonlyUsed flag introduced the name
            // conflict not only for long standard names, but short standard names too.
            // These short names (found in zh_Hant) should be gone once we clean
            // up CLDR time zone display name data. Once the short name conflict
            // problem (with location name) is resolved, we should change the condition
            // below back to the original one above. -Yoshito (2011-09-14)
            if (!isStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
        }
    }

    // Find matches in the local trie
    TimeZoneGenericNameMatchInfo *localMatches = findLocal(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    if (localMatches != NULL) {
        for (int32_t i = 0; i < localMatches->size(); i++) {
            int32_t len = localMatches->getMatchLength(i);

            // TODO See the above TODO. We use len >= bestMatchLen
            // because of the long standard/location name collision
            // problem. If it is also a location name, carrying
            // timeType = UTZFMT_TIME_TYPE_STANDARD will cause a
            // problem in SimpleDateFormat
            if (len >= bestMatchLen) {
                bestMatchLen = localMatches->getMatchLength(i);
                bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;   // because generic
                localMatches->getTimeZoneID(i, bestMatchTzID);
            }
        }
        delete localMatches;
    }

    if (bestMatchLen > 0) {
        timeType = bestMatchTimeType;
        tzID.setTo(bestMatchTzID);
    }
    return bestMatchLen;
}